

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

DataType __thiscall adios2::core::IO::InquireVariableType(IO *this,const_iterator itVariable)

{
  bool bVar1;
  DataType DVar2;
  
  DVar2 = None;
  if (itVariable.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    DVar2 = (*(VariableBase **)
              ((long)itVariable.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
                     ._M_cur + 0x28))->m_Type;
    if (((DVar2 != Struct & this->m_ReadStreaming) == 1) &&
       (bVar1 = VariableBase::IsValidStep
                          (*(VariableBase **)
                            ((long)itVariable.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
                                   ._M_cur + 0x28),this->m_EngineStep + 1), !bVar1)) {
      return None;
    }
  }
  return DVar2;
}

Assistant:

DataType IO::InquireVariableType(const VarMap::const_iterator itVariable) const noexcept
{
    if (itVariable == m_Variables.end())
    {
        return DataType::None;
    }

    const DataType type = itVariable->second->m_Type;

    if (m_ReadStreaming)
    {
        if (type == DataType::Struct)
        {
        }
        else
        {
            if (!itVariable->second->IsValidStep(m_EngineStep + 1))
            {
                return DataType::None;
            }
        }
    }

    return type;
}